

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppAssert.cpp
# Opt level: O0

DefaultFormatter * __thiscall
cppassert::DefaultFormatter::formatStatementFailureMessage_abi_cxx11_
          (DefaultFormatter *this,char *statement)

{
  AssertionMessage *this_00;
  AssertionMessage local_28;
  AssertionMessage msg;
  char *statement_local;
  DefaultFormatter *this_local;
  
  internal::AssertionMessage::AssertionMessage(&local_28);
  this_00 = internal::AssertionMessage::operator<<(&local_28,(char (*) [20])"Assertion failure: ");
  internal::AssertionMessage::operator<<(this_00,(char **)&msg);
  internal::AssertionMessage::str_abi_cxx11_((AssertionMessage *)this);
  internal::AssertionMessage::~AssertionMessage(&local_28);
  return this;
}

Assistant:

std::string DefaultFormatter::formatStatementFailureMessage(const char *statement)
{
    AssertionMessage msg;
    msg<< "Assertion failure: "<<statement;
    return msg.str();
}